

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_channels.cpp
# Opt level: O0

ON_wString GetSortedSemicolonDelimitedString(ON_SimpleArray<ON_UUID_struct> *chan)

{
  int iVar1;
  ON_UUID_struct *uuid;
  ON_wString *s_00;
  ON_SimpleArray<ON_UUID_struct> *in_RSI;
  int local_50;
  int i_1;
  int local_3c;
  undefined1 local_38 [4];
  int i;
  ON_ClassArray<ON_wString> a;
  ON_SimpleArray<ON_UUID_struct> *chan_local;
  ON_wString *s;
  
  a.m_capacity._3_1_ = 0;
  ON_wString::ON_wString((ON_wString *)chan);
  ON_ClassArray<ON_wString>::ON_ClassArray((ON_ClassArray<ON_wString> *)local_38);
  local_3c = 0;
  while( true ) {
    iVar1 = ON_SimpleArray<ON_UUID_struct>::Count(in_RSI);
    if (iVar1 <= local_3c) break;
    uuid = ON_SimpleArray<ON_UUID_struct>::operator[](in_RSI,local_3c);
    ON_UuidToString(uuid,(ON_wString *)chan);
    ON_ClassArray<ON_wString>::Append((ON_ClassArray<ON_wString> *)local_38,(ON_wString *)chan);
    local_3c = local_3c + 1;
  }
  ON_ClassArray<ON_wString>::QuickSort
            ((ON_ClassArray<ON_wString> *)local_38,ON_CompareIncreasing<ON_wString>);
  ON_wString::operator=((ON_wString *)chan,L"");
  local_50 = 0;
  while( true ) {
    iVar1 = ON_ClassArray<ON_wString>::Count((ON_ClassArray<ON_wString> *)local_38);
    if (iVar1 <= local_50) break;
    s_00 = ON_ClassArray<ON_wString>::operator[]((ON_ClassArray<ON_wString> *)local_38,local_50);
    ON_wString::operator+=((ON_wString *)chan,s_00);
    iVar1 = ON_ClassArray<ON_wString>::Count((ON_ClassArray<ON_wString> *)local_38);
    if (local_50 < iVar1 + -1) {
      ON_wString::operator+=((ON_wString *)chan,L";");
    }
    local_50 = local_50 + 1;
  }
  a.m_capacity._3_1_ = 1;
  ON_ClassArray<ON_wString>::~ON_ClassArray((ON_ClassArray<ON_wString> *)local_38);
  if ((a.m_capacity._3_1_ & 1) == 0) {
    ON_wString::~ON_wString((ON_wString *)chan);
  }
  return (ON_wString)(wchar_t *)chan;
}

Assistant:

static ON_wString GetSortedSemicolonDelimitedString(const ON_SimpleArray<ON_UUID>& chan)
{
  ON_wString s;

  ON_ClassArray<ON_wString> a;

  for (int i = 0; i < chan.Count(); i++)
  {
    ON_UuidToString(chan[i], s);
    a.Append(s);
  }

  a.QuickSort(ON_CompareIncreasing);

  s = L"";
  for (int i = 0; i < a.Count(); i++)
  {
    s += a[i];
    if (i < (a.Count() - 1))
      s += L";";
  }

  return s;
}